

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acto.h
# Opt level: O3

enable_if_t<std::is_base_of<_::acto::actor,_Player>::value,_actor_ref> acto::spawn<Player>(void)

{
  actor *this;
  object_t *an_object;
  object_t *in_RDI;
  _Head_base<0UL,_acto::actor_*,_false> local_20;
  actor_ref local_18;
  
  local_18.object_ = (object_t *)0x0;
  this = (actor *)operator_new(0x58);
  Player::Player((Player *)this);
  local_20._M_head_impl = this;
  an_object = core::make_instance(&local_18,shared,
                                  (unique_ptr<acto::actor,_std::default_delete<acto::actor>_> *)
                                  &local_20);
  actor_ref::actor_ref((actor_ref *)in_RDI,an_object,false);
  if (local_20._M_head_impl != (actor *)0x0) {
    (*((actor *)&(local_20._M_head_impl)->_vptr_actor)->_vptr_actor[1])();
  }
  local_20._M_head_impl = (actor *)0x0;
  actor_ref::~actor_ref(&local_18);
  return (enable_if_t<std::is_base_of<_::acto::actor,_Player>::value,_actor_ref>)in_RDI;
}

Assistant:

inline std::enable_if_t<std::is_base_of<::acto::actor, T>::value, actor_ref>
spawn(P&&... p) {
  return actor_ref(
    core::make_instance(actor_ref(), actor_thread::shared,
                        std::make_unique<T>(std::forward<P>(p)...)),
    false);
}